

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildService
          (DescriptorBuilder *this,ServiceDescriptorProto *proto,void *dummy,
          ServiceDescriptor *result)

{
  int size;
  Symbol symbol;
  string *full_name;
  string *psVar1;
  Type *proto_00;
  long lVar2;
  ServiceOptions *orig_options;
  int i;
  long lVar3;
  undefined4 uStack_3c;
  
  full_name = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(this->file_ + 8));
  if (full_name->_M_string_length != 0) {
    std::__cxx11::string::append((ulong)full_name,'\x01');
  }
  std::__cxx11::string::append((string *)full_name);
  ValidateSymbolName(this,proto->name_,full_name,&proto->super_Message);
  psVar1 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)result = psVar1;
  *(string **)(result + 8) = full_name;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  size = (proto->method_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x20) = size;
  AllocateArray<google::protobuf::MethodDescriptor>(this,size,(MethodDescriptor **)(result + 0x28));
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < (proto->method_).super_RepeatedPtrFieldBase.current_size_;
      lVar3 = lVar3 + 1) {
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                         (&(proto->method_).super_RepeatedPtrFieldBase,(int)lVar3);
    BuildMethod(this,proto_00,result,(MethodDescriptor *)(*(long *)(result + 0x28) + lVar2));
    lVar2 = lVar2 + 0x30;
  }
  if ((proto->_has_bits_[0] & 4) == 0) {
    *(undefined8 *)(result + 0x18) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (ServiceOptions *)0x0) {
      orig_options = *(ServiceOptions **)(ServiceDescriptorProto::default_instance_ + 0x30);
    }
    AllocateOptions<google::protobuf::ServiceDescriptor>(this,orig_options,result);
  }
  symbol._4_4_ = uStack_3c;
  symbol.type = 5;
  symbol.field_1.service_descriptor = result;
  AddSymbol(this,*(string **)(result + 8),(void *)0x0,*(string **)result,&proto->super_Message,
            symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildService(const ServiceDescriptorProto& proto,
                                     const void* dummy,
                                     ServiceDescriptor* result) {
  string* full_name = tables_->AllocateString(file_->package());
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_      = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;
  result->file_      = file_;

  BUILD_ARRAY(proto, result, method, BuildMethod, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), NULL, result->name(),
            proto, Symbol(result));
}